

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitAtomicNotify(PrintExpressionContents *this,AtomicNotify *curr)

{
  ostream *poVar1;
  Module *in_R8;
  Name name;
  
  poVar1 = this->o;
  Colors::outputColorCode(poVar1,"\x1b[35m");
  Colors::outputColorCode(poVar1,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"memory.atomic.notify",0x14);
  Colors::outputColorCode(poVar1,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar1 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," offset=",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    return;
  }
  return;
}

Assistant:

void visitAtomicNotify(AtomicNotify* curr) {
    printMedium(o, "memory.atomic.notify");
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
  }